

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class2_test_homography.cc
# Opt level: O3

void denormalize_correspondences
               (Correspondences2D2D *corr,int width1,int height1,int width2,int height2)

{
  pointer pCVar1;
  double *pdVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  
  pCVar1 = (corr->
           super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(corr->
                super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  if (lVar3 != 0) {
    fVar5 = (float)height2;
    lVar3 = lVar3 >> 5;
    if (height2 < width2) {
      height2 = width2;
    }
    fVar4 = (float)height1;
    if (height1 < width1) {
      height1 = width1;
    }
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    pdVar2 = pCVar1->p2 + 1;
    do {
      ((Correspondence2D2D *)(pdVar2 + -3))->p1[0] =
           ((Correspondence2D2D *)(pdVar2 + -3))->p1[0] * (double)height1 +
           (double)((float)width1 * 0.5) + -0.5;
      pdVar2[-2] = pdVar2[-2] * (double)height1 + (double)(fVar4 * 0.5) + -0.5;
      pdVar2[-1] = pdVar2[-1] * (double)height2 + (double)((float)width2 * 0.5) + -0.5;
      *pdVar2 = *pdVar2 * (double)height2 + (double)(fVar5 * 0.5) + -0.5;
      pdVar2 = pdVar2 + 4;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void
denormalize_correspondences (sfm::Correspondences2D2D * corr, int width1, int height1,
    int width2, int height2)
{
    float const img1_width = static_cast<float>(width1);
    float const img1_height = static_cast<float>(height1);
    float const img1_maxdim = static_cast<float>(std::max(width1, height1));
    float const img2_width = static_cast<float>(width2);
    float const img2_height = static_cast<float>(height2);
    float const img2_maxdim = static_cast<float>(std::max(width2, height2));
    for (std::size_t i = 0; i < corr->size(); ++i)
    {
        sfm::Correspondence2D2D & c = corr->at(i);
        c.p1[0] = c.p1[0] * img1_maxdim + img1_width / 2.0f - 0.5f;
        c.p1[1] = c.p1[1] * img1_maxdim + img1_height / 2.0f - 0.5f;
        c.p2[0] = c.p2[0] * img2_maxdim + img2_width / 2.0f - 0.5f;
        c.p2[1] = c.p2[1] * img2_maxdim + img2_height / 2.0f - 0.5f;
    }
}